

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMesh *pMesh)

{
  _Bit_type **pp_Var1;
  float fVar2;
  _Bit_type *p_Var3;
  aiBone **ppaVar4;
  aiBone *paVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ValidateDSProcess *afSum;
  uint **ppuVar10;
  bool bVar11;
  ulong uVar12;
  aiFace *paVar13;
  char *pcVar14;
  uint uVar15;
  ValidateDSProcess *pVVar16;
  char *name;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong local_70;
  ValidateDSProcess local_58;
  undefined8 local_38;
  
  uVar7 = this->mScene->mNumMaterials;
  if ((uVar7 == 0) || (uVar12 = (ulong)pMesh->mMaterialIndex, pMesh->mMaterialIndex < uVar7)) {
    pVVar16 = this;
    Validate(this,&pMesh->mName);
    uVar12 = (ulong)pMesh->mNumFaces;
    if (uVar12 != 0) {
      uVar7 = pMesh->mPrimitiveTypes;
      auVar19._4_4_ = uVar7;
      auVar19._0_4_ = uVar7;
      auVar19._8_4_ = uVar7;
      auVar19._12_4_ = uVar7;
      auVar19 = auVar19 & _DAT_006ffcf0;
      auVar20._0_4_ = -(uint)(auVar19._0_4_ == 0);
      auVar20._4_4_ = -(uint)(auVar19._4_4_ == 0);
      auVar20._8_4_ = -(uint)(auVar19._8_4_ == 0);
      auVar20._12_4_ = -(uint)(auVar19._12_4_ == 0);
      uVar15 = movmskps((int)pVVar16,auVar20);
      pVVar16 = (ValidateDSProcess *)CONCAT44((int)((ulong)pVVar16 >> 0x20),uVar15);
      ppuVar10 = &pMesh->mFaces->mIndices;
      uVar9 = 0;
      do {
        if (uVar7 != 0) {
          switch(((aiFace *)(ppuVar10 + -1))->mNumIndices) {
          case 0:
            pcVar14 = "aiMesh::mFaces[%i].mNumIndices is 0";
            goto LAB_00397d8d;
          case 1:
            if ((uVar15 & 2) != 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes does not report the POINT flag"
              ;
              goto LAB_00397d8d;
            }
            break;
          case 2:
            if ((uVar15 & 4) != 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes does not report the LINE flag"
              ;
              goto LAB_00397d8d;
            }
            break;
          case 3:
            if ((byte)((byte)uVar15 >> 3) != 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes does not report the TRIANGLE flag"
              ;
              goto LAB_00397d8d;
            }
            break;
          default:
            if ((uVar15 & 1) != 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes does not report the POLYGON flag"
              ;
              goto LAB_00397d8d;
            }
          }
        }
        if (*ppuVar10 == (uint *)0x0) {
          pcVar14 = "aiMesh::mFaces[%i].mIndices is NULL";
LAB_00397d8d:
          ReportError(pVVar16,pcVar14,uVar9 & 0xffffffff);
        }
        uVar9 = uVar9 + 1;
        ppuVar10 = ppuVar10 + 2;
      } while (uVar12 != uVar9);
    }
    uVar7 = pMesh->mNumVertices;
    if (((ulong)uVar7 == 0) ||
       ((pMesh->mVertices == (aiVector3D *)0x0 && (this->mScene->mFlags == 0)))) {
      pcVar14 = "The mesh %s contains no vertices";
LAB_00397e28:
      ReportError(pVVar16,pcVar14,(pMesh->mName).data);
    }
    if ((int)uVar7 < 0) {
      pcVar14 = "Mesh has too many vertices: %u, but the limit is %u";
      uVar12 = (ulong)uVar7;
    }
    else {
      if (-1 < (int)pMesh->mNumFaces) {
        if ((pMesh->mBitangents == (aiVector3D *)0x0) == (pMesh->mTangents != (aiVector3D *)0x0)) {
          ReportError(pVVar16,"If there are tangents, bitangent vectors must be present as well");
        }
        if ((uVar12 == 0) || ((pMesh->mFaces == (aiFace *)0x0 && (this->mScene->mFlags == 0)))) {
          pcVar14 = "Mesh %s contains no faces";
          goto LAB_00397e28;
        }
        pVVar16 = &local_58;
        local_58.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
        local_58.super_BaseProcess.shared._0_4_ = 0;
        local_58.super_BaseProcess.progress = (ProgressHandler *)0x0;
        local_58.mScene._0_4_ = 0;
        local_38 = 0;
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)pVVar16,(ulong)uVar7,false);
        uVar7 = pMesh->mNumFaces;
        if (uVar7 != 0) {
          uVar12 = 0;
          do {
            pVVar16 = (ValidateDSProcess *)(uVar12 * 0x10);
            uVar15 = pMesh->mFaces[uVar12].mNumIndices;
            if (0x7fff < uVar15) {
              ReportError(pVVar16,"Face %u has too many faces: %u, but the limit is %u",uVar12,
                          (ulong)uVar15,0x7fff);
            }
            if (uVar15 != 0) {
              paVar13 = pMesh->mFaces + uVar12;
              uVar9 = 0;
              do {
                uVar7 = paVar13->mIndices[uVar9];
                if (pMesh->mNumVertices <= uVar7) {
                  ReportError(pVVar16,"aiMesh::mFaces[%i]::mIndices[%i] is out of range",uVar12,
                              uVar9 & 0xffffffff);
                }
                pp_Var1 = &(((_Bvector_base<std::allocator<bool>_> *)
                            local_58.super_BaseProcess._vptr_BaseProcess)->_M_impl).
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          (uVar7 >> 6);
                *pp_Var1 = (_Bit_type *)((ulong)*pp_Var1 | 1L << ((byte)uVar7 & 0x3f));
                uVar9 = uVar9 + 1;
                pVVar16 = (ValidateDSProcess *)local_58.super_BaseProcess._vptr_BaseProcess;
              } while (uVar9 < paVar13->mNumIndices);
              uVar7 = pMesh->mNumFaces;
            }
            uVar15 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar15;
          } while (uVar15 < uVar7);
        }
        uVar7 = pMesh->mNumVertices;
        if (uVar7 == 0) {
          local_58.super_BaseProcess.progress =
               (ProgressHandler *)local_58.super_BaseProcess._vptr_BaseProcess;
          local_58.mScene._0_4_ = 0;
          uVar7 = 0;
        }
        else {
          uVar12 = 0;
          bVar6 = false;
          do {
            bVar11 = bVar6;
            p_Var3 = (&(((_Bvector_base<std::allocator<bool>_> *)
                        local_58.super_BaseProcess._vptr_BaseProcess)->_M_impl).
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)[uVar12 >> 6]
            ;
            bVar18 = ((ulong)p_Var3 >> (uVar12 & 0x3f) & 1) == 0;
            pVVar16 = (ValidateDSProcess *)CONCAT71((int7)((ulong)p_Var3 >> 8),bVar18);
            uVar15 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar15;
            bVar6 = (bool)(bVar11 | bVar18);
          } while (uVar7 != uVar15);
          local_58.super_BaseProcess.progress =
               (ProgressHandler *)local_58.super_BaseProcess._vptr_BaseProcess;
          local_58.mScene._0_4_ = 0;
          if (bVar11 || bVar18) {
            ReportWarning(pVVar16,"There are unreferenced vertices");
            uVar7 = pMesh->mNumVertices;
          }
        }
        uVar12 = 0;
        do {
          if ((pMesh->mTextureCoords[uVar12] == (aiVector3D *)0x0) || (uVar7 == 0)) {
            if (uVar12 < 8) {
              do {
                if (pMesh->mTextureCoords[uVar12] != (aiVector3D *)0x0 && uVar7 != 0) {
                  ReportError(pVVar16,
                              "Texture coordinate channel %i exists although the previous channel was NULL."
                             );
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != 8);
            }
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 8);
        uVar12 = 0;
        do {
          if ((pMesh->mColors[uVar12] == (aiColor4D *)0x0) || (uVar7 == 0)) {
            if (uVar12 < 8) {
              do {
                if (pMesh->mColors[uVar12] != (aiColor4D *)0x0 && uVar7 != 0) {
                  ReportError(pVVar16,
                              "Vertex color channel %i is exists although the previous channel was NULL."
                             );
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != 8);
            }
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 8);
        if (pMesh->mNumBones == 0) {
          if (pMesh->mBones != (aiBone **)0x0) {
            ReportError(pVVar16,"aiMesh::mBones is non-null although there are no bones");
          }
        }
        else {
          if (pMesh->mBones == (aiBone **)0x0) {
            ReportError(pVVar16,"aiMesh::mBones is NULL (aiMesh::mNumBones is %i)");
          }
          if (uVar7 == 0) {
            afSum = (ValidateDSProcess *)0x0;
          }
          else {
            afSum = (ValidateDSProcess *)operator_new__((ulong)uVar7 << 2);
            pVVar16 = afSum;
            memset(afSum,0,(ulong)uVar7 << 2);
          }
          local_70 = 1;
          uVar12 = 0;
          do {
            uVar7 = pMesh->mBones[uVar12]->mNumWeights;
            if ((int)uVar7 < 0) {
              ReportError(pVVar16,"Bone %u has too many weights: %u, but the limit is %u",
                          uVar12 & 0xffffffff,(ulong)uVar7,0x7fffffff);
            }
            Validate(pVVar16,pMesh,pMesh->mBones[uVar12],(float *)afSum);
            uVar9 = uVar12 + 1;
            uVar7 = pMesh->mNumBones;
            if (uVar7 <= uVar9) break;
            ppaVar4 = pMesh->mBones;
            paVar5 = ppaVar4[uVar12];
            uVar15 = (paVar5->mName).length;
            pcVar14 = (paVar5->mName).data;
            uVar17 = local_70;
            do {
              paVar5 = ppaVar4[uVar17];
              if ((uVar15 == (paVar5->mName).length) &&
                 (pVVar16 = (ValidateDSProcess *)pcVar14,
                 iVar8 = bcmp(pcVar14,(paVar5->mName).data,(ulong)uVar15), iVar8 == 0)) {
                ReportError(pVVar16,
                            "aiMesh::mBones[%i], name = \"%s\" has the same name as aiMesh::mBones[%i]"
                            ,uVar12,pcVar14,uVar17 & 0xffffffff);
              }
              uVar17 = uVar17 + 1;
            } while (uVar7 != (uint)uVar17);
            local_70 = local_70 + 1;
            uVar12 = uVar9;
          } while (uVar9 < uVar7);
          uVar7 = pMesh->mNumVertices;
          if (uVar7 == 0) {
            if (afSum == (ValidateDSProcess *)0x0) goto LAB_00397d3f;
          }
          else {
            uVar12 = 0;
            do {
              fVar2 = *(float *)((long)&(afSum->super_BaseProcess)._vptr_BaseProcess + uVar12 * 4);
              if (((fVar2 != 0.0) || (NAN(fVar2))) && ((fVar2 <= 0.94 || (1.05 <= fVar2)))) {
                ReportWarning(pVVar16,"aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",
                              uVar12 & 0xffffffff);
                uVar7 = pMesh->mNumVertices;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < uVar7);
          }
          operator_delete__(afSum);
        }
LAB_00397d3f:
        if ((ValidateDSProcess *)local_58.super_BaseProcess._vptr_BaseProcess !=
            (ValidateDSProcess *)0x0) {
          operator_delete(local_58.super_BaseProcess._vptr_BaseProcess);
        }
        return;
      }
      pcVar14 = "Mesh has too many faces: %u, but the limit is %u";
    }
    uVar9 = 0x7fffffff;
    this = pVVar16;
  }
  else {
    uVar9 = (ulong)(uVar7 - 1);
    pcVar14 = "aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)";
  }
  ReportError(this,pcVar14,uVar12,uVar9);
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh)
{
    // validate the material index of the mesh
    if (mScene->mNumMaterials && pMesh->mMaterialIndex >= mScene->mNumMaterials)
    {
        ReportError("aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)",
            pMesh->mMaterialIndex,mScene->mNumMaterials-1);
    }

    Validate(&pMesh->mName);

    for (unsigned int i = 0; i < pMesh->mNumFaces; ++i)
    {
        aiFace& face = pMesh->mFaces[i];

        if (pMesh->mPrimitiveTypes)
        {
            switch (face.mNumIndices)
            {
            case 0:
                ReportError("aiMesh::mFaces[%i].mNumIndices is 0",i);
                break;
            case 1:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POINT))
                {
                    ReportError("aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes "
                        "does not report the POINT flag",i);
                }
                break;
            case 2:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_LINE))
                {
                    ReportError("aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes "
                        "does not report the LINE flag",i);
                }
                break;
            case 3:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE))
                {
                    ReportError("aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes "
                        "does not report the TRIANGLE flag",i);
                }
                break;
            default:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON))
                {
                    this->ReportError("aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes "
                        "does not report the POLYGON flag",i);
                }
                break;
            };
        }

        if (!face.mIndices)
            ReportError("aiMesh::mFaces[%i].mIndices is NULL",i);
    }

    // positions must always be there ...
    if (!pMesh->mNumVertices || (!pMesh->mVertices && !mScene->mFlags)) {
        ReportError("The mesh %s contains no vertices", pMesh->mName.C_Str());
    }

    if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        ReportError("Mesh has too many vertices: %u, but the limit is %u",pMesh->mNumVertices,AI_MAX_VERTICES);
    }
    if (pMesh->mNumFaces > AI_MAX_FACES) {
        ReportError("Mesh has too many faces: %u, but the limit is %u",pMesh->mNumFaces,AI_MAX_FACES);
    }

    // if tangents are there there must also be bitangent vectors ...
    if ((pMesh->mTangents != NULL) != (pMesh->mBitangents != NULL)) {
        ReportError("If there are tangents, bitangent vectors must be present as well");
    }

    // faces, too
    if (!pMesh->mNumFaces || (!pMesh->mFaces && !mScene->mFlags))   {
        ReportError("Mesh %s contains no faces", pMesh->mName.C_Str());
    }

    // now check whether the face indexing layout is correct:
    // unique vertices, pseudo-indexed.
    std::vector<bool> abRefList;
    abRefList.resize(pMesh->mNumVertices,false);
    for (unsigned int i = 0; i < pMesh->mNumFaces;++i)
    {
        aiFace& face = pMesh->mFaces[i];
        if (face.mNumIndices > AI_MAX_FACE_INDICES) {
            ReportError("Face %u has too many faces: %u, but the limit is %u",i,face.mNumIndices,AI_MAX_FACE_INDICES);
        }

        for (unsigned int a = 0; a < face.mNumIndices;++a)
        {
            if (face.mIndices[a] >= pMesh->mNumVertices)    {
                ReportError("aiMesh::mFaces[%i]::mIndices[%i] is out of range",i,a);
            }
            // the MSB flag is temporarily used by the extra verbose
            // mode to tell us that the JoinVerticesProcess might have
            // been executed already.
			/*if ( !(this->mScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT ) && !(this->mScene->mFlags & AI_SCENE_FLAGS_ALLOW_SHARED) &&
				abRefList[face.mIndices[a]])
            {
                ReportError("aiMesh::mVertices[%i] is referenced twice - second "
                    "time by aiMesh::mFaces[%i]::mIndices[%i]",face.mIndices[a],i,a);
            }*/
            abRefList[face.mIndices[a]] = true;
        }
    }

    // check whether there are vertices that aren't referenced by a face
    bool b = false;
    for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
        if (!abRefList[i])b = true;
    }
    abRefList.clear();
    if (b) {
    	ReportWarning("There are unreferenced vertices");
    }

    // texture channel 2 may not be set if channel 1 is zero ...
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
        {
            if (!pMesh->HasTextureCoords(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            if (pMesh->HasTextureCoords(i))
            {
                ReportError("Texture coordinate channel %i exists "
                    "although the previous channel was NULL.",i);
            }
    }
    // the same for the vertex colors
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
        {
            if (!pMesh->HasVertexColors(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
            if (pMesh->HasVertexColors(i))
            {
                ReportError("Vertex color channel %i is exists "
                    "although the previous channel was NULL.",i);
            }
    }


    // now validate all bones
    if (pMesh->mNumBones)
    {
        if (!pMesh->mBones)
        {
            ReportError("aiMesh::mBones is NULL (aiMesh::mNumBones is %i)",
                pMesh->mNumBones);
        }
        std::unique_ptr<float[]> afSum(nullptr);
        if (pMesh->mNumVertices)
        {
            afSum.reset(new float[pMesh->mNumVertices]);
            for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
                afSum[i] = 0.0f;
        }

        // check whether there are duplicate bone names
        for (unsigned int i = 0; i < pMesh->mNumBones;++i)
        {
            const aiBone* bone = pMesh->mBones[i];
            if (bone->mNumWeights > AI_MAX_BONE_WEIGHTS) {
                ReportError("Bone %u has too many weights: %u, but the limit is %u",i,bone->mNumWeights,AI_MAX_BONE_WEIGHTS);
            }

            if (!pMesh->mBones[i])
            {
                ReportError("aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",
                    i,pMesh->mNumBones);
            }
            Validate(pMesh,pMesh->mBones[i],afSum.get());

            for (unsigned int a = i+1; a < pMesh->mNumBones;++a)
            {
                if (pMesh->mBones[i]->mName == pMesh->mBones[a]->mName)
                {
                    const char *name = "unknown";
                    if (nullptr != pMesh->mBones[ i ]->mName.C_Str()) {
                        name = pMesh->mBones[ i ]->mName.C_Str();
                    }
                    ReportError("aiMesh::mBones[%i], name = \"%s\" has the same name as "
                        "aiMesh::mBones[%i]", i, name, a );
                }
            }
        }
        // check whether all bone weights for a vertex sum to 1.0 ...
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
        {
            if (afSum[i] && (afSum[i] <= 0.94 || afSum[i] >= 1.05)) {
                ReportWarning("aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",i,afSum[i]);
            }
        }
    }
    else if (pMesh->mBones)
    {
        ReportError("aiMesh::mBones is non-null although there are no bones");
    }
}